

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

Expression *
slang::ast::OpenRangeExpression::fromSyntax
          (Compilation *comp,OpenRangeExpressionSyntax *syntax,ASTContext *context)

{
  bool bVar1;
  logic_t lVar2;
  ExpressionSyntax *pEVar3;
  Expression *pEVar4;
  Expression *args_2;
  OpenRangeExpression *expr;
  Type *pTVar5;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *rhs;
  SourceLocation location;
  Diagnostic *pDVar6;
  bitmask<slang::ast::ASTFlags> extraFlags;
  not_null<const_slang::ast::Type_*> rt;
  not_null<const_slang::ast::Type_*> lt;
  ConstantValue cvl;
  ConstantValue cvr;
  not_null<const_slang::ast::Type_*> local_90;
  not_null<const_slang::ast::Type_*> local_88;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_80;
  char local_60;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  char local_38;
  
  extraFlags.m_bits._0_4_ = (uint)(context->flags).m_bits & 0x800;
  extraFlags.m_bits._4_4_ = 0;
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->left);
  pEVar4 = Expression::create(comp,pEVar3,context,extraFlags,(Type *)0x0);
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->right);
  args_2 = Expression::create(comp,pEVar3,context,extraFlags,(Type *)0x0);
  pTVar5 = comp->voidType;
  local_80._M_rest._0_16_ =
       (undefined1  [16])slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::OpenRangeExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
                   (&comp->super_BumpAllocator,pTVar5,pEVar4,args_2,(SourceRange *)&local_80);
  bVar1 = Expression::bad(pEVar4);
  if ((!bVar1) && (bVar1 = Expression::bad(args_2), !bVar1)) {
    not_null<slang::ast::Type_const*>::not_null<slang::not_null<slang::ast::Type_const*>&,void>
              ((not_null<slang::ast::Type_const*> *)&local_88,&pEVar4->type);
    not_null<slang::ast::Type_const*>::not_null<slang::not_null<slang::ast::Type_const*>&,void>
              ((not_null<slang::ast::Type_const*> *)&local_90,&args_2->type);
    pTVar5 = not_null<const_slang::ast::Type_*>::get(&local_88);
    bVar1 = Type::isUnbounded(pTVar5);
    if (bVar1) {
      local_58._0_8_ = comp->intType;
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                ((not_null<slang::ast::Type_const*> *)&local_80,(Type **)&local_58);
      local_88.ptr = (Type *)local_80._0_8_;
      pTVar5 = not_null<const_slang::ast::Type_*>::get(&local_90);
      bVar1 = Type::isUnbounded(pTVar5);
      if (bVar1) {
        ASTContext::addDiag(context,(DiagCode)0x740007,(expr->super_Expression).sourceRange);
      }
    }
    pTVar5 = not_null<const_slang::ast::Type_*>::get(&local_90);
    bVar1 = Type::isUnbounded(pTVar5);
    if (bVar1) {
      local_58._0_8_ = comp->intType;
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                ((not_null<slang::ast::Type_const*> *)&local_80,(Type **)&local_58);
      local_90.ptr = (Type *)local_80._0_8_;
    }
    pTVar5 = not_null<const_slang::ast::Type_*>::get(&local_88);
    bVar1 = Type::isNumeric(pTVar5);
    if (bVar1) {
      pTVar5 = not_null<const_slang::ast::Type_*>::get(&local_90);
      bVar1 = Type::isNumeric(pTVar5);
      if (bVar1) goto LAB_0032315b;
    }
    bVar1 = Expression::isImplicitString(pEVar4);
    if ((bVar1) && (bVar1 = Expression::isImplicitString(args_2), bVar1)) {
LAB_0032315b:
      ASTContext::tryEval((ConstantValue *)&local_80,context,pEVar4);
      ASTContext::tryEval((ConstantValue *)&local_58,context,args_2);
      if ((local_60 == '\x01') && (local_38 == '\x01')) {
        this = std::
               get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                         ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_80);
        rhs = std::
              get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                          *)&local_58);
        lVar2 = SVInt::operator>(this,rhs);
        if (((lVar2.value != '\0') && (lVar2.value != 0x80)) && (lVar2.value != '@')) {
          ASTContext::addDiag(context,(DiagCode)0xa00007,(expr->super_Expression).sourceRange);
        }
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_58);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_80);
      return &expr->super_Expression;
    }
    location = parsing::Token::location(&syntax->colon);
    pDVar6 = ASTContext::addDiag(context,(DiagCode)0x240007,location);
    pDVar6 = Diagnostic::operator<<(pDVar6,pEVar4->sourceRange);
    pDVar6 = Diagnostic::operator<<(pDVar6,args_2->sourceRange);
    pTVar5 = not_null<const_slang::ast::Type_*>::get(&local_88);
    pDVar6 = ast::operator<<(pDVar6,pTVar5);
    pTVar5 = not_null<const_slang::ast::Type_*>::get(&local_90);
    ast::operator<<(pDVar6,pTVar5);
  }
  pEVar4 = Expression::badExpr(comp,&expr->super_Expression);
  return pEVar4;
}

Assistant:

Expression& OpenRangeExpression::fromSyntax(Compilation& comp,
                                            const OpenRangeExpressionSyntax& syntax,
                                            const ASTContext& context) {
    // If we are allowed unbounded literals here, pass that along to subexpressions.
    bitmask<ASTFlags> flags = ASTFlags::None;
    if (context.flags.has(ASTFlags::AllowUnboundedLiteral))
        flags = ASTFlags::AllowUnboundedLiteral;

    Expression& left = create(comp, *syntax.left, context, flags);
    Expression& right = create(comp, *syntax.right, context, flags);

    auto result = comp.emplace<OpenRangeExpression>(comp.getVoidType(), left, right,
                                                    syntax.sourceRange());
    if (left.bad() || right.bad())
        return badExpr(comp, result);

    auto lt = left.type;
    auto rt = right.type;
    if (lt->isUnbounded()) {
        lt = &comp.getIntType();
        if (rt->isUnbounded())
            context.addDiag(diag::OpenRangeUnbounded, result->sourceRange);
    }

    if (rt->isUnbounded())
        rt = &comp.getIntType();

    if (!(lt->isNumeric() && rt->isNumeric()) &&
        !(left.isImplicitString() && right.isImplicitString())) {
        auto& diag = context.addDiag(diag::BadOpenRange, syntax.colon.location());
        diag << left.sourceRange << right.sourceRange << *lt << *rt;
        return badExpr(comp, result);
    }

    auto cvl = context.tryEval(left);
    auto cvr = context.tryEval(right);
    if (cvl.isInteger() && cvr.isInteger() && bool(cvl.integer() > cvr.integer()))
        context.addDiag(diag::ReversedOpenRange, result->sourceRange);

    return *result;
}